

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkDirectoriesCommand.cxx
# Opt level: O1

string * __thiscall
cmTargetLinkDirectoriesCommand::Join
          (string *__return_storage_ptr__,cmTargetLinkDirectoriesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> unixPath;
  string tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  string local_98;
  long *local_78 [2];
  long local_68 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string *local_40;
  cmTargetLinkDirectoriesCommand *local_38;
  
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar5 = (content->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (content->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_40 = __return_storage_ptr__;
  local_38 = this;
  if (pbVar5 != pbVar1) {
    do {
      pcVar2 = (pbVar5->_M_dataplus)._M_p;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar2,pcVar2 + pbVar5->_M_string_length);
      cmsys::SystemTools::ConvertToUnixSlashes(&local_98);
      bVar3 = cmsys::SystemTools::FileIsFullPath(&local_98);
      if ((!bVar3) &&
         (((local_98._M_string_length < 2 || (*local_98._M_dataplus._M_p != '$')) ||
          (local_98._M_dataplus._M_p[1] != '<')))) {
        psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                           ((local_38->super_cmTargetPropCommandBase).super_cmCommand.Makefile);
        local_78[0] = local_68;
        pcVar2 = (psVar4->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_78,pcVar2,pcVar2 + psVar4->_M_string_length);
        std::__cxx11::string::append((char *)local_78);
        std::__cxx11::string::_M_append((char *)local_78,(ulong)local_98._M_dataplus._M_p);
        std::__cxx11::string::_M_assign((string *)&local_98);
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_58,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar1);
  }
  psVar4 = local_40;
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (local_40,&local_58,";");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return psVar4;
}

Assistant:

std::string cmTargetLinkDirectoriesCommand::Join(
  const std::vector<std::string>& content)
{
  std::vector<std::string> directories;

  for (const auto& dir : content) {
    auto unixPath = dir;
    cmSystemTools::ConvertToUnixSlashes(unixPath);
    if (!cmSystemTools::FileIsFullPath(unixPath) &&
        !cmGeneratorExpression::StartsWithGeneratorExpression(unixPath)) {
      auto tmp = this->Makefile->GetCurrentSourceDirectory();
      tmp += "/";
      tmp += unixPath;
      unixPath = tmp;
    }
    directories.push_back(unixPath);
  }

  return cmJoin(directories, ";");
}